

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::slotSaveBoard(Fifteen *this)

{
  Controller *this_00;
  QArrayData *pQVar1;
  size_type sVar2;
  char16_t *pcVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QString file;
  QString local_a0;
  QArrayData *local_88;
  char16_t *pcStack_80;
  size_type local_78;
  string local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  size_type local_38;
  QArrayData *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  QVar4.m_data = (storage_type *)0x0;
  QVar4.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar4);
  local_88 = (QArrayData *)local_68._M_dataplus._M_p;
  pcStack_80 = (char16_t *)local_68._M_string_length;
  local_78 = local_68.field_2._M_allocated_capacity;
  QVar5.m_data = (storage_type *)0x0;
  QVar5.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar5);
  local_48 = (QArrayData *)local_68._M_dataplus._M_p;
  pcStack_40 = (char16_t *)local_68._M_string_length;
  local_38 = local_68.field_2._M_allocated_capacity;
  QDir::currentPath();
  local_28 = (QArrayData *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  QFileDialog::getSaveFileName(&local_a0,this,&local_48,&local_68,&local_28,0,0);
  sVar2 = local_78;
  pcVar3 = pcStack_80;
  pQVar1 = local_88;
  local_88 = &(local_a0.d.d)->super_QArrayData;
  local_a0.d.d = (Data *)pQVar1;
  pcStack_80 = local_a0.d.ptr;
  local_78 = local_a0.d.size;
  local_a0.d.ptr = pcVar3;
  local_a0.d.size = sVar2;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,2,8);
    }
  }
  if ((QArrayData *)local_68._M_dataplus._M_p != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_68._M_dataplus._M_p = *(int *)local_68._M_dataplus._M_p + -1;
    UNLOCK();
    if (*(int *)local_68._M_dataplus._M_p == 0) {
      QArrayData::deallocate((QArrayData *)local_68._M_dataplus._M_p,2,8);
    }
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  if (local_78 != 0) {
    this_00 = (this->controller)._M_t.
              super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
              super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
              super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
    QString::toUtf8_helper(&local_a0);
    pcVar3 = local_a0.d.ptr;
    if (local_a0.d.ptr == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QByteArray::_empty;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar3,local_a0.d.size + (long)pcVar3);
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,8);
      }
    }
    Controller::writeBoardIntoFile(this_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  return;
}

Assistant:

void Fifteen::slotSaveBoard()
{
    QString file = nullptr;
    if ( file = QFileDialog::getSaveFileName( this, "", QDir::currentPath() );
         file.isEmpty() )
    {
        return;
    }
    controller->writeBoardIntoFile( file.toStdString() );
}